

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

boolean block_door(xchar x,xchar y)

{
  int iVar1;
  char *pcVar2;
  monst *mtmp;
  char *pcVar3;
  bool bVar4;
  monst *shkp;
  int roomno;
  xchar y_local;
  xchar x_local;
  
  pcVar2 = in_rooms(level,x,y,0x12);
  iVar1 = (int)*pcVar2;
  if ((iVar1 < 0) || (level->rooms[iVar1].rtype < '\x12')) {
    return '\0';
  }
  if (level->locations[x][y].typ != '\x17') {
    return '\0';
  }
  if (iVar1 != u.ushops[0]) {
    return '\0';
  }
  mtmp = shop_keeper(level,*pcVar2);
  if ((mtmp == (monst *)0x0) || (iVar1 = inhishop(mtmp), iVar1 == 0)) {
    return '\0';
  }
  if (((mtmp->mx == (char)mtmp[0x1b].movement) &&
      (((mtmp->my == *(char *)((long)&mtmp[0x1b].movement + 1) &&
        ((char)mtmp[0x1b].mintrinsics == x)) && (*(char *)((long)&mtmp[0x1b].mintrinsics + 1) == y))
      )) && ((((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0 &&
              ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0)) &&
             ((*(int *)&mtmp[0x1b].field_0x60 != 0 ||
              ((*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) != 0 ||
               (iVar1._0_1_ = mtmp[0x1b].mtame, iVar1._1_1_ = mtmp[0x1b].m_ap_type,
               iVar1._2_1_ = mtmp[0x1b].mfrozen, iVar1._3_1_ = mtmp[0x1b].mblinded, iVar1 != 0))))))
            )) {
    pcVar2 = shkname(mtmp);
    if ((((u.uprops[0xd].intrinsic != 0) || (u.uprops[0xd].extrinsic != 0)) ||
        (youmonst.data == mons + 0x9e)) || (bVar4 = false, youmonst.data == mons + 0x7b)) {
      bVar4 = u.uprops[0xd].blocked == 0;
    }
    pcVar3 = "";
    if (bVar4) {
      pcVar3 = " senses your motion and";
    }
    pline("%s%s blocks your way!",pcVar2,pcVar3);
    return '\x01';
  }
  return '\0';
}

Assistant:

boolean block_door(xchar x, xchar y)
{
	int roomno = *in_rooms(level, x, y, SHOPBASE);
	struct monst *shkp;

	if (roomno < 0 || !IS_SHOP(level, roomno)) return FALSE;
	if (!IS_DOOR(level->locations[x][y].typ)) return FALSE;
	if (roomno != *u.ushops) return FALSE;

	if (!(shkp = shop_keeper(level, (char)roomno)) || !inhishop(shkp))
		return FALSE;

	if (shkp->mx == ESHK(shkp)->shk.x && shkp->my == ESHK(shkp)->shk.y
	    /* Actually, the shk should be made to block _any_
	     * door, including a door the player digs, if the
	     * shk is within a 'jumping' distance.
	     */
	    && ESHK(shkp)->shd.x == x && ESHK(shkp)->shd.y == y
	    && shkp->mcanmove && !shkp->msleeping
	    && (ESHK(shkp)->debit || ESHK(shkp)->billct ||
		ESHK(shkp)->robbed)) {
		pline("%s%s blocks your way!", shkname(shkp),
				Invis ? " senses your motion and" : "");
		return TRUE;
	}
	return FALSE;
}